

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O0

bool get_current_dms_text_descriptor(MXFWriter *writer,GenericStreamTextBasedSet **text_object)

{
  bool bVar1;
  long *plVar2;
  Dictionary *this;
  byte_t *pbVar3;
  reference ppIVar4;
  undefined8 local_d8;
  Result_t local_a0 [104];
  undefined1 local_38 [8];
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  object_list;
  GenericStreamTextBasedSet **text_object_local;
  MXFWriter *writer_local;
  
  object_list.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size = (size_t)text_object;
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::list
            ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_38);
  plVar2 = (long *)(**(code **)(*(long *)writer + 0x10))();
  this = (Dictionary *)ASDCP::DefaultSMPTEDict();
  pbVar3 = ASDCP::Dictionary::ul(this,MDD_GenericStreamTextBasedSet);
  (**(code **)(*plVar2 + 0xb0))(local_a0,plVar2,pbVar3,local_38);
  Kumu::Result_t::~Result_t(local_a0);
  bVar1 = std::__cxx11::
          list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
          empty((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                 *)local_38);
  if (bVar1) {
    writer_local._7_1_ = false;
  }
  else {
    ppIVar4 = std::__cxx11::
              list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              ::back((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                      *)local_38);
    if (*ppIVar4 == (value_type)0x0) {
      local_d8 = 0;
    }
    else {
      local_d8 = __dynamic_cast(*ppIVar4,&ASDCP::MXF::InterchangeObject::typeinfo,
                                &ASDCP::MXF::GenericStreamTextBasedSet::typeinfo,0);
    }
    *(undefined8 *)
     object_list.
     super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
     ._M_impl._M_node._M_size = local_d8;
    if (*(long *)object_list.
                 super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                 ._M_impl._M_node._M_size == 0) {
      __assert_fail("text_object != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/as-02-wrap.cpp"
                    ,0x708,
                    "bool get_current_dms_text_descriptor(AS_02::ISXD::MXFWriter &, ASDCP::MXF::GenericStreamTextBasedSet *&)"
                   );
    }
    writer_local._7_1_ = true;
  }
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::~list
            ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_38);
  return writer_local._7_1_;
}

Assistant:

bool
get_current_dms_text_descriptor(AS_02::ISXD::MXFWriter& writer, ASDCP::MXF::GenericStreamTextBasedSet *&text_object)
{
  std::list<MXF::InterchangeObject*> object_list;
  writer.OP1aHeader().GetMDObjectsByType(DefaultSMPTEDict().ul(MDD_GenericStreamTextBasedSet), object_list);

  if ( object_list.empty() )
    {
      return false;
    }

  text_object = dynamic_cast<MXF::GenericStreamTextBasedSet*>(object_list.back());
  assert(text_object != 0);
  return true;
}